

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_short,_charls::quad<unsigned_short>_>,_charls::decoder_strategy>
          *this,quad<unsigned_short> *param_1)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  pixel_type *ppVar8;
  pixel_type *ppVar9;
  sample_type sVar10;
  sample_type sVar11;
  sample_type sVar12;
  sample_type sVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  uint rc;
  uint rc_00;
  uint rc_01;
  uint rb;
  uint rb_00;
  int qs;
  uint ra;
  uint ra_00;
  uint ra_01;
  int qs_00;
  int qs_01;
  int qs_02;
  uint start_index;
  
  start_index = 0;
  while (start_index < this->width_) {
    ppVar8 = this->previous_line_;
    ppVar9 = this->current_line_;
    ra = (uint)ppVar9[(long)(int)start_index + -1].super_triplet<unsigned_short>.field_0.v1;
    ra_00 = (uint)ppVar9[(long)(int)start_index + -1].super_triplet<unsigned_short>.field_1.v2;
    ra_01 = (uint)ppVar9[(long)(int)start_index + -1].super_triplet<unsigned_short>.field_2.v3;
    uVar1 = ppVar9[(long)(int)start_index + -1].field_0.v4;
    uVar2 = ppVar8[(long)(int)start_index + -1].super_triplet<unsigned_short>.field_0.v1;
    rc = (uint)ppVar8[(long)(int)start_index + -1].super_triplet<unsigned_short>.field_1.v2;
    rc_00 = (uint)ppVar8[(long)(int)start_index + -1].super_triplet<unsigned_short>.field_2.v3;
    rc_01 = (uint)ppVar8[(long)(int)start_index + -1].field_0.v4;
    uVar3 = ppVar8[(int)start_index].super_triplet<unsigned_short>.field_0.v1;
    uVar4 = ppVar8[(int)start_index].super_triplet<unsigned_short>.field_1.v2;
    rb = (uint)ppVar8[(int)start_index].super_triplet<unsigned_short>.field_2.v3;
    rb_00 = (uint)ppVar8[(int)start_index].field_0.v4;
    uVar5 = ppVar8[(long)(int)start_index + 1].super_triplet<unsigned_short>.field_1.v2;
    uVar6 = ppVar8[(long)(int)start_index + 1].super_triplet<unsigned_short>.field_2.v3;
    uVar7 = ppVar8[(long)(int)start_index + 1].field_0.v4;
    iVar14 = quantize_gradient(this,(uint)ppVar8[(long)(int)start_index + 1].
                                          super_triplet<unsigned_short>.field_0.v1 - (uint)uVar3);
    iVar15 = quantize_gradient(this,(uint)uVar3 - (uint)uVar2);
    iVar16 = quantize_gradient(this,uVar2 - ra);
    qs = (iVar14 * 9 + iVar15) * 9 + iVar16;
    iVar14 = quantize_gradient(this,(uint)uVar5 - (uint)uVar4);
    iVar15 = quantize_gradient(this,uVar4 - rc);
    iVar16 = quantize_gradient(this,rc - ra_00);
    qs_02 = (iVar14 * 9 + iVar15) * 9 + iVar16;
    iVar14 = quantize_gradient(this,uVar6 - rb);
    iVar15 = quantize_gradient(this,rb - rc_00);
    iVar16 = quantize_gradient(this,rc_00 - ra_01);
    qs_01 = (iVar14 * 9 + iVar15) * 9 + iVar16;
    iVar14 = quantize_gradient(this,uVar7 - rb_00);
    iVar15 = quantize_gradient(this,rb_00 - rc_01);
    iVar16 = quantize_gradient(this,rc_01 - uVar1);
    qs_00 = (iVar14 * 9 + iVar15) * 9 + iVar16;
    if (((qs_02 == 0 && qs == 0) && qs_01 == 0) && qs_00 == 0) {
      iVar14 = do_run_mode(this,start_index,(decoder_strategy *)0x0);
      start_index = start_index + iVar14;
    }
    else {
      uVar5 = this->current_line_[(int)start_index].super_triplet<unsigned_short>.field_0.v1;
      iVar14 = get_predicted_value(ra,(uint)uVar3,(uint)uVar2);
      sVar10 = do_regular(this,qs,(uint)uVar5,iVar14,(decoder_strategy *)0x0);
      uVar2 = this->current_line_[(int)start_index].super_triplet<unsigned_short>.field_1.v2;
      iVar14 = get_predicted_value(ra_00,(uint)uVar4,rc);
      sVar11 = do_regular(this,qs_02,(uint)uVar2,iVar14,(decoder_strategy *)0x0);
      uVar2 = this->current_line_[(int)start_index].super_triplet<unsigned_short>.field_2.v3;
      iVar14 = get_predicted_value(ra_01,rb,rc_00);
      sVar12 = do_regular(this,qs_01,(uint)uVar2,iVar14,(decoder_strategy *)0x0);
      uVar2 = this->current_line_[(int)start_index].field_0.v4;
      iVar14 = get_predicted_value((uint)uVar1,rb_00,rc_01);
      sVar13 = do_regular(this,qs_00,(uint)uVar2,iVar14,(decoder_strategy *)0x0);
      this->current_line_[(int)start_index] =
           (pixel_type)
           ((ulong)sVar10 | (ulong)sVar11 << 0x10 | (ulong)sVar12 << 0x20 | (ulong)sVar13 << 0x30);
      start_index = start_index + 1;
    }
  }
  return;
}

Assistant:

void do_line(quad<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const quad<sample_type> ra{current_line_[index - 1]};
            const quad<sample_type> rc{previous_line_[index - 1]};
            const quad<sample_type> rb{previous_line_[index]};
            const quad<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};
            const int32_t qs4{compute_context_id(quantize_gradient(rd.v4 - rb.v4), quantize_gradient(rb.v4 - rc.v4),
                                                 quantize_gradient(rc.v4 - ra.v4))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0 && qs4 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                quad<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                rx.v4 = do_regular(qs4, current_line_[index].v4, get_predicted_value(ra.v4, rb.v4, rc.v4),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }